

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

void __thiscall ON_PolynomialSurface::ON_PolynomialSurface(ON_PolynomialSurface *this)

{
  ON_Interval *local_28;
  ON_PolynomialSurface *this_local;
  
  this->m_dim = 0;
  this->m_is_rat = 0;
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  local_28 = (ON_Interval *)&this->field_0x28;
  do {
    ON_Interval::ON_Interval(local_28);
    local_28 = local_28 + 1;
  } while ((ON_PolynomialSurface *)local_28 != this + 1);
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0x3ff0000000000000;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x40 = 0x3ff0000000000000;
  return;
}

Assistant:

ON_PolynomialSurface::ON_PolynomialSurface() : m_dim(0), m_is_rat(0)
{
  m_order[0] = 0;
  m_order[1] = 0;
  m_domain[0].m_t[0] = 0.0;
  m_domain[0].m_t[1] = 1.0;
  m_domain[1].m_t[0] = 0.0;
  m_domain[1].m_t[1] = 1.0;
}